

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__init_private__native
                    (ma_dr_flac_init_info *pInit,ma_dr_flac_read_proc onRead,
                    ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,void *pUserData,
                    void *pUserDataMD,ma_bool32 relaxed)

{
  ma_uint8 mVar1;
  ma_bool32 mVar2;
  size_t sVar3;
  ma_dr_flac_seek_origin extraout_EDX;
  ma_uint32 blockHeader;
  ma_dr_flac_streaminfo local_110;
  uint local_e0 [2];
  undefined8 local_d8;
  undefined4 local_d0;
  ma_uint64 mStack_b0;
  ma_uint8 local_a8 [8];
  ma_uint8 amStack_a0 [112];
  
  pInit->container = ma_dr_flac_container_native;
  sVar3 = (*onRead)(onMeta,local_e0,4);
  if (sVar3 == 4) {
    if ((local_e0[0] >> 0x18 | (local_e0[0] & 0xff0000) >> 8 | (local_e0[0] & 0xff00) << 8 |
        local_e0[0] << 0x18 & 0x7fffffff) == 0x22) {
      mVar2 = ma_dr_flac__read_streaminfo(onRead,onMeta,&local_110);
      if (mVar2 != 0) {
        pInit->hasStreamInfoBlock = 1;
        pInit->sampleRate = local_110.sampleRate;
        pInit->channels = local_110.channels;
        pInit->bitsPerSample = local_110.bitsPerSample;
        pInit->totalPCMFrameCount = local_110.totalPCMFrameCount;
        pInit->maxBlockSizeInPCMFrames = local_110.maxBlockSizeInPCMFrames;
        pInit->hasMetadataBlocks = ~(local_e0[0] << 0x18) >> 0x1f;
        if (onSeek == (ma_dr_flac_seek_proc)0x0) {
          return 1;
        }
        local_e0[0] = 0;
        local_d8 = 0;
        local_d0 = 0;
        mStack_b0 = local_110.totalPCMFrameCount;
        local_a8[0] = local_110.md5[0];
        local_a8[1] = local_110.md5[1];
        local_a8[2] = local_110.md5[2];
        local_a8[3] = local_110.md5[3];
        local_a8[4] = local_110.md5[4];
        local_a8[5] = local_110.md5[5];
        local_a8[6] = local_110.md5[6];
        local_a8[7] = local_110.md5[7];
        amStack_a0[0] = local_110.md5[8];
        amStack_a0[1] = local_110.md5[9];
        amStack_a0[2] = local_110.md5[10];
        amStack_a0[3] = local_110.md5[0xb];
        amStack_a0[4] = local_110.md5[0xc];
        amStack_a0[5] = local_110.md5[0xd];
        amStack_a0[6] = local_110.md5[0xe];
        amStack_a0[7] = local_110.md5[0xf];
        (*onSeek)(pUserData,(int)local_e0,extraout_EDX);
        return 1;
      }
    }
    else if ((int)pUserDataMD != 0) {
      pInit->hasStreamInfoBlock = 0;
      pInit->hasMetadataBlocks = 0;
      mVar2 = ma_dr_flac__read_next_flac_frame_header(&pInit->bs,'\0',&pInit->firstFrameHeader);
      if (mVar2 == 0) {
        return 0;
      }
      mVar1 = (pInit->firstFrameHeader).bitsPerSample;
      if (mVar1 == '\0') {
        return 0;
      }
      pInit->sampleRate = (pInit->firstFrameHeader).sampleRate;
      pInit->channels = (&DAT_0017c9f0)[(char)(pInit->firstFrameHeader).channelAssignment];
      pInit->bitsPerSample = mVar1;
      pInit->maxBlockSizeInPCMFrames = 0xffff;
      return 1;
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__init_private__native(ma_dr_flac_init_info* pInit, ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, void* pUserData, void* pUserDataMD, ma_bool32 relaxed)
{
    ma_uint8 isLastBlock;
    ma_uint8 blockType;
    ma_uint32 blockSize;
    (void)onSeek;
    pInit->container = ma_dr_flac_container_native;
    if (!ma_dr_flac__read_and_decode_block_header(onRead, pUserData, &isLastBlock, &blockType, &blockSize)) {
        return MA_FALSE;
    }
    if (blockType != MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO || blockSize != 34) {
        if (!relaxed) {
            return MA_FALSE;
        } else {
            pInit->hasStreamInfoBlock = MA_FALSE;
            pInit->hasMetadataBlocks  = MA_FALSE;
            if (!ma_dr_flac__read_next_flac_frame_header(&pInit->bs, 0, &pInit->firstFrameHeader)) {
                return MA_FALSE;
            }
            if (pInit->firstFrameHeader.bitsPerSample == 0) {
                return MA_FALSE;
            }
            pInit->sampleRate              = pInit->firstFrameHeader.sampleRate;
            pInit->channels                = ma_dr_flac__get_channel_count_from_channel_assignment(pInit->firstFrameHeader.channelAssignment);
            pInit->bitsPerSample           = pInit->firstFrameHeader.bitsPerSample;
            pInit->maxBlockSizeInPCMFrames = 65535;
            return MA_TRUE;
        }
    } else {
        ma_dr_flac_streaminfo streaminfo;
        if (!ma_dr_flac__read_streaminfo(onRead, pUserData, &streaminfo)) {
            return MA_FALSE;
        }
        pInit->hasStreamInfoBlock      = MA_TRUE;
        pInit->sampleRate              = streaminfo.sampleRate;
        pInit->channels                = streaminfo.channels;
        pInit->bitsPerSample           = streaminfo.bitsPerSample;
        pInit->totalPCMFrameCount      = streaminfo.totalPCMFrameCount;
        pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
        pInit->hasMetadataBlocks       = !isLastBlock;
        if (onMeta) {
            ma_dr_flac_metadata metadata;
            metadata.type = MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO;
            metadata.pRawData = NULL;
            metadata.rawDataSize = 0;
            metadata.data.streaminfo = streaminfo;
            onMeta(pUserDataMD, &metadata);
        }
        return MA_TRUE;
    }
}